

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O1

Atom_p __thiscall indigox::Molecule::NewAtom(Molecule *this)

{
  MolecularGraph *this_00;
  Atom *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>,_bool> pVar2
  ;
  Atom_p AVar3;
  Atom_p local_50;
  void *local_40;
  Molecule_p local_38;
  
  this_01 = (Atom *)operator_new(0x90);
  std::__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<indigox::Molecule,void>
            ((__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  Atom::Atom(this_01,&local_38);
  (this->super_CountableObject<indigox::Molecule>).id_ = (uid_t)this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<indigox::Atom*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<indigox::Molecule>,this_01);
  std::__shared_ptr<indigox::Atom,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<indigox::Atom,indigox::Atom>
            ((__shared_ptr<indigox::Atom,(__gnu_cxx::_Lock_policy)2> *)this,this_01);
  if (local_38.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<std::shared_ptr<indigox::Atom>,std::allocator<std::shared_ptr<indigox::Atom>>>::
  emplace_back<std::shared_ptr<indigox::Atom>&>
            ((vector<std::shared_ptr<indigox::Atom>,std::allocator<std::shared_ptr<indigox::Atom>>>
              *)(in_RSI + 0x40),(shared_ptr<indigox::Atom> *)this);
  local_40 = (void *)Atom::GetIndex((Atom *)(this->super_CountableObject<indigox::Molecule>).id_);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_long,std::shared_ptr<indigox::Atom>&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(in_RSI + 0x70),&local_40,this);
  this_00 = *(MolecularGraph **)(in_RSI + 0x140);
  local_50.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this->super_CountableObject<indigox::Molecule>).id_;
  local_50.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
       super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((element_type *)
      local_50.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((element_type *)
                local_50.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
               super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)
                     local_50.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>).
                    _M_weak_this.super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((element_type *)
                local_50.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
               super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)
                     local_50.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->super_enable_shared_from_this<indigox::Molecule>).
                    _M_weak_this.super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
    }
  }
  local_40 = MolecularGraph::AddVertex(this_00,&local_50);
  pVar2 = std::
          _Rb_tree<std::shared_ptr<indigox::Atom>,std::pair<std::shared_ptr<indigox::Atom>const,void*>,std::_Select1st<std::pair<std::shared_ptr<indigox::Atom>const,void*>>,std::less<std::shared_ptr<indigox::Atom>>,std::allocator<std::pair<std::shared_ptr<indigox::Atom>const,void*>>>
          ::_M_emplace_unique<std::shared_ptr<indigox::Atom>&,void*>
                    ((_Rb_tree<std::shared_ptr<indigox::Atom>,std::pair<std::shared_ptr<indigox::Atom>const,void*>,std::_Select1st<std::pair<std::shared_ptr<indigox::Atom>const,void*>>,std::less<std::shared_ptr<indigox::Atom>>,std::allocator<std::pair<std::shared_ptr<indigox::Atom>const,void*>>>
                      *)(in_RSI + 0xe0),(shared_ptr<indigox::Atom> *)this,&local_40);
  _Var1._M_pi = pVar2._8_8_;
  if ((element_type *)
      local_50.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  *(undefined1 *)(in_RSI + 0x158) = 1;
  AVar3.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  AVar3.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Atom_p)AVar3.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p Molecule::NewAtom() {
  Atom_p atm = Atom_p(new Atom(shared_from_this()));
  atoms_.emplace_back(atm);
  idx_to_atom_.emplace(atm->GetIndex(), atm);
  atom_to_vertex_.emplace(atm, graph_->AddVertex(atm));
  modified_ = true;
  return atm;
}